

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_array_concat(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val_00;
  JSValue val_01;
  long lVar1;
  uint uVar2;
  int iVar3;
  JSValueUnion JVar4;
  ulong uVar5;
  JSRefCountHeader *p_1;
  uint uVar6;
  int64_t iVar7;
  JSValueUnion JVar8;
  int64_t iVar9;
  long idx;
  uint uVar10;
  JSRefCountHeader *p_2;
  bool bVar11;
  JSValue obj;
  JSValue obj_00;
  JSValue JVar12;
  JSValue this_obj;
  JSValue JVar13;
  JSValue prop;
  JSValue prop_00;
  JSValue obj_01;
  JSValue this_obj_00;
  JSValue val_02;
  int64_t len;
  JSValue val;
  JSValueUnion local_a8;
  int64_t local_a0;
  JSValueUnion local_88;
  int64_t local_80;
  long local_50;
  JSValueUnion local_48;
  int64_t iStack_40;
  
  JVar12 = JS_ToObject(ctx,this_val);
  uVar10 = (uint)JVar12.tag;
  local_88 = JVar12.u;
  if (uVar10 == 6) {
LAB_00160844:
    if (uVar10 < 0xfffffff5) {
      local_a0 = 6;
      local_a8.float64 = 0.0;
      goto LAB_0016087e;
    }
    iVar3 = *local_88.ptr;
    *(int *)local_88.ptr = iVar3 + -1;
    local_a0 = 6;
    local_a8.float64 = 0.0;
  }
  else {
    this_obj = JS_ArraySpeciesCreate(ctx,JVar12,(JSValue)ZEXT816(0));
    local_a8 = this_obj.u;
    local_a0 = this_obj.tag;
    if ((uint)this_obj.tag == 6) {
LAB_00160811:
      if ((0xfffffff4 < (uint)this_obj.tag) &&
         (iVar3 = *local_a8.ptr, *(int *)local_a8.ptr = iVar3 + -1, iVar3 < 2)) {
        __JS_FreeValueRT(ctx->rt,this_obj);
      }
      goto LAB_00160844;
    }
    local_80 = JVar12.tag;
    if (argc < 0) {
      uVar5 = 0;
    }
    else {
      uVar6 = 0xffffffff;
      uVar5 = 0;
      do {
        JVar8 = local_88;
        iVar9 = local_80;
        if (-1 < (int)uVar6) {
          JVar8 = (JSValueUnion)argv[uVar6].u.ptr;
          iVar9 = argv[uVar6].tag;
        }
        if ((uint)iVar9 == 0xffffffff) {
          JVar13.tag = iVar9;
          JVar13.u.ptr = JVar8.ptr;
          this_obj_00.tag = iVar9;
          this_obj_00.u.ptr = JVar8.ptr;
          JVar13 = JS_GetPropertyInternal(ctx,JVar13,0xcd,this_obj_00,0);
          if ((int)JVar13.tag == 3) {
            if (*(short *)((long)JVar8.ptr + 6) == 0x29) {
              obj_00.tag = iVar9;
              obj_00.u.ptr = JVar8.ptr;
              uVar2 = js_proxy_isArray(ctx,obj_00);
              goto LAB_00160928;
            }
            uVar2 = (uint)(*(short *)((long)JVar8.ptr + 6) == 2);
          }
          else {
            if ((int)JVar13.tag == 6) goto LAB_00160811;
            uVar2 = JS_ToBoolFree(ctx,JVar13);
LAB_00160928:
            if ((int)uVar2 < 0) goto LAB_00160811;
          }
          if (uVar2 == 0) goto LAB_00160a4b;
          obj_01.tag = iVar9;
          obj_01.u.ptr = JVar8.ptr;
          iVar3 = js_get_length64(ctx,&local_50,obj_01);
          lVar1 = local_50;
          if (iVar3 != 0) goto LAB_00160811;
          if (0x1fffffffffffff < (long)(local_50 + uVar5)) goto LAB_00160b7e;
          if (0 < local_50) {
            idx = 0;
            do {
              obj.tag = iVar9;
              obj.u.ptr = JVar8.ptr;
              iVar3 = JS_TryGetPropertyInt64(ctx,obj,idx,(JSValue *)&local_48);
              if (iVar3 < 0) goto LAB_00160811;
              if (iVar3 != 0) {
                JVar4.float64 = (double)(long)(uVar5 + idx);
                if (uVar5 + 0x80000000 + idx >> 0x20 == 0) {
                  iVar7 = 0;
                  JVar4.ptr = (void *)(uVar5 + idx & 0xffffffff);
                }
                else {
                  iVar7 = 7;
                }
                val_00.tag = iStack_40;
                val_00.u.float64 = local_48.float64;
                prop.tag = iVar7;
                prop.u.ptr = JVar4.ptr;
                iVar3 = JS_DefinePropertyValueValue(ctx,this_obj,prop,val_00,0x4007);
                if (iVar3 < 0) goto LAB_00160811;
              }
              idx = idx + 1;
            } while (lVar1 != idx);
            uVar5 = uVar5 + idx;
          }
        }
        else {
LAB_00160a4b:
          if (0x1ffffffffffffe < (long)uVar5) {
LAB_00160b7e:
            JS_ThrowTypeError(ctx,"Array loo long");
            goto LAB_00160811;
          }
          if (0xfffffff4 < (uint)iVar9) {
            *(int *)JVar8.ptr = *JVar8.ptr + 1;
          }
          bVar11 = (long)(int)uVar5 == uVar5;
          JVar4.float64 = (double)(long)uVar5;
          if (bVar11) {
            JVar4.ptr = (void *)(uVar5 & 0xffffffff);
          }
          iVar7 = 7;
          if (bVar11) {
            iVar7 = 0;
          }
          val_01.tag = iVar9;
          val_01.u.ptr = JVar8.ptr;
          prop_00.tag = iVar7;
          prop_00.u.float64 = JVar4.float64;
          iVar3 = JS_DefinePropertyValueValue(ctx,this_obj,prop_00,val_01,0x4007);
          if (iVar3 < 0) goto LAB_00160811;
          uVar5 = uVar5 + 1;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != argc);
    }
    bVar11 = (long)(int)uVar5 == uVar5;
    JVar8.float64 = (double)(long)uVar5;
    if (bVar11) {
      JVar8.ptr = (void *)(uVar5 & 0xffffffff);
    }
    iVar9 = 7;
    if (bVar11) {
      iVar9 = 0;
    }
    val_02.tag = iVar9;
    val_02.u.float64 = JVar8.float64;
    iVar3 = JS_SetPropertyInternal(ctx,this_obj,0x30,val_02,0x4000);
    if (iVar3 < 0) goto LAB_00160811;
    if (uVar10 < 0xfffffff5) goto LAB_0016087e;
    iVar3 = *local_88.ptr;
    *(int *)local_88.ptr = iVar3 + -1;
  }
  if (iVar3 < 2) {
    __JS_FreeValueRT(ctx->rt,JVar12);
  }
LAB_0016087e:
  JVar12.tag = local_a0;
  JVar12.u.float64 = local_a8.float64;
  return JVar12;
}

Assistant:

static JSValue js_array_concat(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv)
{
    JSValue obj, arr, val;
    JSValueConst e;
    int64_t len, k, n;
    int i, res;

    arr = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        goto exception;

    arr = JS_ArraySpeciesCreate(ctx, obj, JS_NewInt32(ctx, 0));
    if (JS_IsException(arr))
        goto exception;
    n = 0;
    for (i = -1; i < argc; i++) {
        if (i < 0)
            e = obj;
        else
            e = argv[i];

        res = JS_isConcatSpreadable(ctx, e);
        if (res < 0)
            goto exception;
        if (res) {
            if (js_get_length64(ctx, &len, e))
                goto exception;
            if (n + len > MAX_SAFE_INTEGER) {
                JS_ThrowTypeError(ctx, "Array loo long");
                goto exception;
            }
            for (k = 0; k < len; k++, n++) {
                res = JS_TryGetPropertyInt64(ctx, e, k, &val);
                if (res < 0)
                    goto exception;
                if (res) {
                    if (JS_DefinePropertyValueInt64(ctx, arr, n, val,
                                                    JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                        goto exception;
                }
            }
        } else {
            if (n >= MAX_SAFE_INTEGER) {
                JS_ThrowTypeError(ctx, "Array loo long");
                goto exception;
            }
            if (JS_DefinePropertyValueInt64(ctx, arr, n, JS_DupValue(ctx, e),
                                            JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
            n++;
        }
    }
    if (JS_SetProperty(ctx, arr, JS_ATOM_length, JS_NewInt64(ctx, n)) < 0)
        goto exception;

    JS_FreeValue(ctx, obj);
    return arr;

exception:
    JS_FreeValue(ctx, arr);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}